

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::FindRequiresForMessage
          (Generator *this,GeneratorOptions *options,Descriptor *desc,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards,bool *have_message)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *pFVar3;
  Descriptor *desc_00;
  int local_5c;
  int i_2;
  FieldDescriptor *field_1;
  int i_1;
  FieldDescriptor *field;
  int i;
  bool *have_message_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *forwards_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *required_local;
  Descriptor *desc_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  bVar1 = NamespaceOnly(desc);
  if (!bVar1) {
    *have_message = true;
    for (field._4_4_ = 0; iVar2 = Descriptor::field_count(desc), field._4_4_ < iVar2;
        field._4_4_ = field._4_4_ + 1) {
      pFVar3 = Descriptor::field(desc,field._4_4_);
      bVar1 = anon_unknown_0::IgnoreField(pFVar3);
      if (!bVar1) {
        FindRequiresForField(this,options,pFVar3,required,forwards);
      }
    }
  }
  for (field_1._4_4_ = 0; iVar2 = Descriptor::extension_count(desc), field_1._4_4_ < iVar2;
      field_1._4_4_ = field_1._4_4_ + 1) {
    pFVar3 = Descriptor::extension(desc,field_1._4_4_);
    bVar1 = anon_unknown_0::IgnoreField(pFVar3);
    if (!bVar1) {
      FindRequiresForExtension(this,options,pFVar3,required,forwards);
    }
  }
  for (local_5c = 0; iVar2 = Descriptor::nested_type_count(desc), local_5c < iVar2;
      local_5c = local_5c + 1) {
    desc_00 = Descriptor::nested_type(desc,local_5c);
    FindRequiresForMessage(this,options,desc_00,required,forwards,have_message);
  }
  return;
}

Assistant:

void Generator::FindRequiresForMessage(
    const GeneratorOptions& options,
    const Descriptor* desc,
    std::set<string>* required,
    std::set<string>* forwards,
    bool* have_message) const {


  if (!NamespaceOnly(desc)) {
    *have_message = true;
    for (int i = 0; i < desc->field_count(); i++) {
      const FieldDescriptor* field = desc->field(i);
      if (IgnoreField(field)) {
        continue;
      }
      FindRequiresForField(options, field, required, forwards);
    }
  }

  for (int i = 0; i < desc->extension_count(); i++) {
    const FieldDescriptor* field = desc->extension(i);
    if (IgnoreField(field)) {
      continue;
    }
    FindRequiresForExtension(options, field, required, forwards);
  }

  for (int i = 0; i < desc->nested_type_count(); i++) {
    FindRequiresForMessage(options, desc->nested_type(i), required, forwards,
                           have_message);
  }
}